

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BeagleCPUImpl.hpp
# Opt level: O1

void __thiscall
beagle::cpu::BeagleCPUImpl<float,_1,_0>::calcRootLogLikelihoodsByPartition
          (BeagleCPUImpl<float,_1,_0> *this,int *bufferIndices,int *categoryWeightsIndices,
          int *stateFrequenciesIndices,int *cumulativeScaleIndices,int *partitionIndices,
          int partitionCount,double *outSumLogLikelihoodByPartition)

{
  int iVar1;
  int iVar2;
  uint uVar3;
  int iVar4;
  int iVar5;
  float *pfVar6;
  float *pfVar7;
  float *pfVar8;
  float *pfVar9;
  double *pdVar10;
  long lVar11;
  long lVar12;
  int iVar13;
  int iVar14;
  long lVar15;
  ulong uVar16;
  int iVar17;
  int iVar18;
  int iVar19;
  int k;
  int iVar20;
  long lVar21;
  double dVar22;
  undefined1 auVar23 [16];
  undefined1 auVar24 [64];
  undefined1 auVar25 [16];
  undefined8 in_XMM2_Qb;
  int local_8c;
  
  if (0 < partitionCount) {
    uVar16 = 0;
    do {
      iVar1 = this->gPatternPartitionsStartPatterns[partitionIndices[uVar16]];
      iVar2 = this->gPatternPartitionsStartPatterns[(long)partitionIndices[uVar16] + 1];
      lVar21 = (long)iVar2;
      pfVar6 = this->gPartials[bufferIndices[uVar16]];
      pfVar7 = this->gCategoryWeights[categoryWeightsIndices[uVar16]];
      pfVar8 = this->gStateFrequencies[stateFrequenciesIndices[uVar16]];
      uVar3 = cumulativeScaleIndices[uVar16];
      iVar4 = this->kStateCount;
      iVar5 = this->kPartialsPaddedStateCount;
      local_8c = iVar4 * iVar1;
      iVar13 = iVar5 * iVar1;
      if (iVar1 < iVar2) {
        pfVar9 = this->integrationTmp;
        iVar17 = iVar1;
        iVar18 = local_8c;
        do {
          if (0 < iVar4) {
            iVar20 = 0;
            lVar12 = 0;
            do {
              *(float *)((long)pfVar9 + lVar12 + (long)iVar18 * 4) =
                   *(float *)((long)pfVar6 + lVar12 + (long)iVar13 * 4) * *pfVar7;
              lVar12 = lVar12 + 4;
              iVar20 = iVar20 + -1;
            } while (-iVar4 != iVar20);
            iVar18 = iVar18 - iVar20;
            iVar13 = iVar13 - iVar20;
          }
          iVar17 = iVar17 + 1;
        } while (iVar17 != iVar2);
      }
      iVar17 = this->kCategoryCount;
      if (1 < (long)iVar17) {
        iVar18 = this->kPatternCount;
        lVar12 = 1;
        do {
          iVar13 = iVar13 + ((iVar1 - iVar2) + iVar18) * iVar5;
          if (iVar1 < iVar2) {
            pfVar9 = this->integrationTmp;
            iVar20 = iVar1;
            iVar19 = local_8c;
            do {
              if (0 < iVar4) {
                iVar14 = 0;
                lVar15 = 0;
                do {
                  auVar23 = vfmadd213ss_fma(ZEXT416((uint)pfVar7[lVar12]),
                                            ZEXT416(*(uint *)((long)pfVar6 +
                                                             lVar15 + (long)iVar13 * 4)),
                                            ZEXT416(*(uint *)((long)pfVar9 +
                                                             lVar15 + (long)iVar19 * 4)));
                  *(int *)((long)pfVar9 + lVar15 + (long)iVar19 * 4) = auVar23._0_4_;
                  lVar15 = lVar15 + 4;
                  iVar14 = iVar14 + -1;
                } while (-iVar4 != iVar14);
                iVar19 = iVar19 - iVar14;
                iVar13 = iVar13 - iVar14;
              }
              iVar20 = iVar20 + 1;
            } while (iVar20 != iVar2);
          }
          lVar12 = lVar12 + 1;
        } while (lVar12 != iVar17);
      }
      lVar15 = (long)iVar1;
      lVar12 = lVar15;
      if (iVar1 < iVar2) {
        do {
          iVar4 = this->kStateCount;
          if ((long)iVar4 < 1) {
            dVar22 = 0.0;
          }
          else {
            auVar23 = ZEXT816(0);
            lVar11 = 0;
            do {
              auVar23 = vfmadd231ss_fma(auVar23,ZEXT416((uint)pfVar8[lVar11]),
                                        ZEXT416((uint)this->integrationTmp[local_8c + lVar11]));
              lVar11 = lVar11 + 1;
            } while (iVar4 != lVar11);
            local_8c = local_8c + iVar4;
            dVar22 = (double)auVar23._0_4_;
          }
          dVar22 = log(dVar22);
          this->outLogLikelihoodsTmp[lVar12] = (float)dVar22;
          lVar12 = lVar12 + 1;
        } while (lVar12 != lVar21);
      }
      if ((-1 < (int)uVar3) && (iVar1 < iVar2)) {
        pfVar6 = this->gScaleBuffers[uVar3];
        pfVar7 = this->outLogLikelihoodsTmp;
        lVar12 = lVar15;
        do {
          pfVar7[lVar12] = pfVar6[lVar12] + pfVar7[lVar12];
          lVar12 = lVar12 + 1;
        } while (lVar21 != lVar12);
      }
      outSumLogLikelihoodByPartition[uVar16] = 0.0;
      if (iVar1 < iVar2) {
        pdVar10 = this->gPatternWeights;
        pfVar6 = this->outLogLikelihoodsTmp;
        auVar24 = ZEXT864((ulong)outSumLogLikelihoodByPartition[uVar16]);
        do {
          auVar25._0_8_ = (double)pfVar6[lVar15];
          auVar25._8_8_ = in_XMM2_Qb;
          auVar23._8_8_ = 0;
          auVar23._0_8_ = pdVar10[lVar15];
          auVar23 = vfmadd231sd_fma(auVar24._0_16_,auVar25,auVar23);
          auVar24 = ZEXT1664(auVar23);
          outSumLogLikelihoodByPartition[uVar16] = auVar23._0_8_;
          lVar15 = lVar15 + 1;
        } while (lVar21 != lVar15);
      }
      uVar16 = uVar16 + 1;
    } while (uVar16 != (uint)partitionCount);
  }
  return;
}

Assistant:

BEAGLE_CPU_TEMPLATE
void BeagleCPUImpl<BEAGLE_CPU_GENERIC>::calcRootLogLikelihoodsByPartition(
                                                         const int* bufferIndices,
                                                         const int* categoryWeightsIndices,
                                                         const int* stateFrequenciesIndices,
                                                         const int* cumulativeScaleIndices,
                                                         const int* partitionIndices,
                                                         int partitionCount,
                                                         double* outSumLogLikelihoodByPartition) {

    for (int p = 0; p < partitionCount; p++) {
        int pIndex = partitionIndices[p];

        int startPattern = gPatternPartitionsStartPatterns[pIndex];
        int endPattern = gPatternPartitionsStartPatterns[pIndex + 1];

        const REALTYPE* rootPartials = gPartials[bufferIndices[p]];
        const REALTYPE* wt = gCategoryWeights[categoryWeightsIndices[p]];
        const REALTYPE* freqs = gStateFrequencies[stateFrequenciesIndices[p]];
        const int scalingFactorsIndex = cumulativeScaleIndices[p];
        int u = startPattern * kStateCount;
        int v = startPattern * kPartialsPaddedStateCount;
        for (int k = startPattern; k < endPattern; k++) {
            for (int i = 0; i < kStateCount; i++) {
                integrationTmp[u] = rootPartials[v] * (REALTYPE) wt[0];
                u++;
                v++;
            }
            v += P_PAD;
        }
        for (int l = 1; l < kCategoryCount; l++) {
            u = startPattern * kStateCount;
            v += ((kPatternCount - endPattern) + startPattern) * kPartialsPaddedStateCount;
            for (int k = startPattern; k < endPattern; k++) {
                for (int i = 0; i < kStateCount; i++) {
                    integrationTmp[u] += rootPartials[v] * (REALTYPE) wt[l];
                    u++;
                    v++;
                }
                v += P_PAD;
            }
        }
        u = startPattern * kStateCount;
        for (int k = startPattern; k < endPattern; k++) {
            REALTYPE sum = 0.0;
            for (int i = 0; i < kStateCount; i++) {
                sum += freqs[i] * integrationTmp[u];
                u++;
            }

            outLogLikelihoodsTmp[k] = log(sum);
        }

        if (scalingFactorsIndex >= 0) {
            const REALTYPE* cumulativeScaleFactors = gScaleBuffers[scalingFactorsIndex];
            for(int i=startPattern; i<endPattern; i++) {
                outLogLikelihoodsTmp[i] += cumulativeScaleFactors[i];
            }
        }

        outSumLogLikelihoodByPartition[p] = 0.0;
        for (int i = startPattern; i < endPattern; i++) {
            outSumLogLikelihoodByPartition[p] += outLogLikelihoodsTmp[i] * gPatternWeights[i];
        }

    }

}